

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O1

void re_print(regex_t *pattern)

{
  uchar uVar1;
  regex_t *prVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  do {
    if ((ulong)pattern[lVar4].type == 0) {
      return;
    }
    prVar2 = pattern + lVar4;
    printf("type: %s",&DAT_0012149c + *(int *)(&DAT_0012149c + (ulong)pattern[lVar4].type * 4));
    if (prVar2->type - 8 < 2) {
      printf(" [");
      lVar3 = 0;
      do {
        uVar1 = (prVar2->field_1).ccl[lVar3];
        if ((uVar1 == '\0') || (uVar1 == ']')) break;
        putchar((int)(char)uVar1);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x28);
      putchar(0x5d);
    }
    else if (prVar2->type == 7) {
      printf(" \'%c\'",(ulong)(prVar2->field_1).ch);
    }
    putchar(10);
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x1e) {
      return;
    }
  } while( true );
}

Assistant:

void re_print(regex_t* pattern)
{
  const char* types[] = { "UNUSED", "DOT", "BEGIN", "END", "QUESTIONMARK", "STAR", "PLUS", "CHAR", "CHAR_CLASS", "INV_CHAR_CLASS", "DIGIT", "NOT_DIGIT", "ALPHA", "NOT_ALPHA", "WHITESPACE", "NOT_WHITESPACE", "BRANCH" };

  int i;
  for (i = 0; i < MAX_REGEXP_OBJECTS; ++i)
  {
    if (pattern[i].type == UNUSED)
    {
      break;
    }

    printf("type: %s", types[pattern[i].type]);
    if (pattern[i].type == CHAR_CLASS || pattern[i].type == INV_CHAR_CLASS)
    {
      printf(" [");
      int j;
      char c;
      for (j = 0; j < MAX_CHAR_CLASS_LEN; ++j)
      {
        c = pattern[i].ccl[j];
        if ((c == '\0') || (c == ']'))
        {
          break;
        }
        printf("%c", c);
      }
      printf("]");
    }
    else if (pattern[i].type == CHAR)
    {
      printf(" '%c'", pattern[i].ch);
    }
    printf("\n");
  }
}